

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlPrinter::~TiXmlPrinter(TiXmlPrinter *this)

{
  TiXmlPrinter *this_local;
  
  *(undefined ***)this = &PTR__TiXmlPrinter_0026f830;
  TiXmlString::~TiXmlString(&this->lineBreak);
  TiXmlString::~TiXmlString(&this->indent);
  TiXmlString::~TiXmlString(&this->buffer);
  TiXmlVisitor::~TiXmlVisitor(&this->super_TiXmlVisitor);
  return;
}

Assistant:

TiXmlPrinter() :
		depth(0),
		simpleTextPrint(false),
		buffer(),
		indent("    "),
		lineBreak("\n") {
	}